

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tool_cb_dbg.c
# Opt level: O2

int tool_debug_cb(CURL *handle,curl_infotype type,char *data,size_t size,void *userdata)

{
  trace tVar1;
  GlobalConfig *config;
  byte *__filename;
  char cVar2;
  int iVar3;
  uint uVar4;
  tm *ptVar5;
  FILE **ppFVar6;
  FILE *pFVar7;
  char *pcVar8;
  long lVar9;
  ulong uVar10;
  FILE *__stream;
  long lVar11;
  ulong uVar12;
  bool bVar13;
  timeval tVar14;
  char timebuf [20];
  curl_off_t xfer_id;
  char idsbuf [60];
  curl_off_t conn_id;
  
  __stream = (FILE *)tool_stderr;
  config = *(GlobalConfig **)((long)userdata + 0x3b0);
  if ((config->field_0x63 & 0x20) == 0) {
    timebuf[0] = '\0';
  }
  else {
    tVar14 = tvrealnow();
    idsbuf._0_8_ = tVar14.tv_sec;
    if (hms_for_sec_cached_tv_sec != idsbuf._0_8_) {
      ptVar5 = localtime((time_t *)idsbuf);
      curl_msnprintf(hms_for_sec_hms_buf,0xc,"%02d:%02d:%02d",ptVar5->tm_hour,ptVar5->tm_min,
                     ptVar5->tm_sec);
      hms_for_sec_cached_tv_sec._0_1_ = idsbuf[0];
      hms_for_sec_cached_tv_sec._1_1_ = idsbuf[1];
      hms_for_sec_cached_tv_sec._2_1_ = idsbuf[2];
      hms_for_sec_cached_tv_sec._3_1_ = idsbuf[3];
      hms_for_sec_cached_tv_sec._4_1_ = idsbuf[4];
      hms_for_sec_cached_tv_sec._5_1_ = idsbuf[5];
      hms_for_sec_cached_tv_sec._6_1_ = idsbuf[6];
      hms_for_sec_cached_tv_sec._7_1_ = idsbuf[7];
    }
    curl_msnprintf(timebuf,0x14,"%s.%06ld ",hms_for_sec_hms_buf,tVar14.tv_usec);
  }
  if ((((handle == (CURL *)0x0) || ((config->field_0x63 & 0x40) == 0)) ||
      (iVar3 = curl_easy_getinfo(handle,0x60003f,&xfer_id), iVar3 != 0)) || (xfer_id < 0)) {
    idsbuf._0_8_ = idsbuf._0_8_ & 0xffffffffffffff00;
  }
  else {
    iVar3 = curl_easy_getinfo(handle,0x600040,&conn_id);
    if (conn_id < 0 || iVar3 != 0) {
      curl_msnprintf(idsbuf,0x3c,"[%ld-x] ",xfer_id);
    }
    else {
      curl_msnprintf(idsbuf,0x3c,"[%ld-%ld] ",xfer_id);
    }
  }
  pFVar7 = (FILE *)config->trace_stream;
  if (pFVar7 == (FILE *)0x0) {
    __filename = (byte *)config->trace_dump;
    if (*__filename == 0x2d) {
      if (__filename[1] != 0) {
LAB_0010abef:
        pFVar7 = fopen64((char *)__filename,"w");
        config->trace_stream = (FILE *)pFVar7;
        config->field_0x63 = config->field_0x63 | 0x10;
        goto LAB_0010ac32;
      }
      ppFVar6 = (FILE **)&stdout;
    }
    else {
      uVar4 = *__filename - 0x25;
      if (uVar4 == 0) {
        uVar4 = (uint)__filename[1];
      }
      if (uVar4 != 0) goto LAB_0010abef;
      ppFVar6 = &tool_stderr;
    }
    pFVar7 = (FILE *)*ppFVar6;
    config->trace_stream = (FILE *)pFVar7;
  }
LAB_0010ac32:
  if (pFVar7 != (FILE *)0x0) {
    __stream = pFVar7;
  }
  if (__stream == (FILE *)0x0) {
    warnf(config,"Failed to create/open output");
    return 0;
  }
  tVar1 = config->tracetype;
  if (tVar1 == TRACE_PLAIN) {
    if (type - CURLINFO_DATA_IN < 4) {
      if (tool_debug_cb_traced_data != '\0') {
        return 0;
      }
      if ((config->field_0x64 & 4) != 0) {
        if (__stream == (FILE *)tool_stderr) {
          return 0;
        }
        if (__stream == _stdout) {
          return 0;
        }
      }
      if (tool_debug_cb::newl == false) {
        log_line_start((FILE *)__stream,timebuf,idsbuf,type);
      }
      curl_mfprintf(__stream,"[%zu bytes data]\n",size);
      tool_debug_cb::newl = false;
      tool_debug_cb_traced_data = 1;
      return 0;
    }
    if (type < CURLINFO_HEADER_OUT) {
      if (tool_debug_cb::newl == false) {
        log_line_start((FILE *)__stream,timebuf,idsbuf,type);
      }
      fwrite(data,size,1,__stream);
      if (size != 0) {
        cVar2 = data[size - 1];
LAB_0010b047:
        tool_debug_cb::newl = cVar2 != '\n';
        tool_debug_cb_traced_data = 0;
        return 0;
      }
    }
    else {
      if (type != CURLINFO_HEADER_OUT) {
        tool_debug_cb::newl = false;
        tool_debug_cb_traced_data = 0;
        return 0;
      }
      if (size != 0) {
        lVar11 = 0;
        do {
          lVar9 = -1;
          pcVar8 = data;
          while( true ) {
            if (lVar11 - size == lVar9) {
              if (tool_debug_cb::newl == false) {
                log_line_start((FILE *)__stream,timebuf,idsbuf,CURLINFO_HEADER_OUT);
              }
              fwrite(data + lVar11,size - lVar11,1,__stream);
              cVar2 = data[size - 1];
              goto LAB_0010b047;
            }
            if (pcVar8[lVar11] == '\n') break;
            lVar9 = lVar9 + -1;
            pcVar8 = pcVar8 + 1;
          }
          if (tool_debug_cb::newl == false) {
            log_line_start((FILE *)__stream,timebuf,idsbuf,CURLINFO_HEADER_OUT);
          }
          pcVar8 = data + lVar11;
          lVar11 = lVar11 - lVar9;
          fwrite(pcVar8,-lVar9,1,__stream);
          tool_debug_cb::newl = false;
        } while( true );
      }
    }
    tool_debug_cb::newl = false;
    tool_debug_cb_traced_data = 0;
    return 0;
  }
  switch(type) {
  case CURLINFO_TEXT:
    curl_mfprintf(__stream,"%s%s== Info: %.*s",timebuf,idsbuf,size & 0xffffffff,data);
    return 0;
  case CURLINFO_HEADER_IN:
    pcVar8 = "<= Recv header";
    break;
  case CURLINFO_HEADER_OUT:
    pcVar8 = "=> Send header";
    break;
  case CURLINFO_DATA_IN:
    pcVar8 = "<= Recv data";
    break;
  case CURLINFO_DATA_OUT:
    pcVar8 = "=> Send data";
    break;
  case CURLINFO_SSL_DATA_IN:
    pcVar8 = "<= Recv SSL data";
    break;
  case CURLINFO_SSL_DATA_OUT:
    pcVar8 = "=> Send SSL data";
    break;
  default:
    goto switchD_0010ad13_default;
  }
  lVar11 = 0x10;
  if (tVar1 == TRACE_ASCII) {
    lVar11 = 0x40;
  }
  curl_mfprintf(__stream,"%s%s%s, %zu bytes (0x%zx)\n",timebuf,idsbuf,pcVar8,size,size);
  for (uVar12 = 0; uVar12 < size; uVar12 = uVar12 + lVar11) {
    curl_mfprintf(__stream,"%04zx: ",uVar12);
    uVar10 = uVar12;
    lVar9 = lVar11;
    if (tVar1 == TRACE_BIN) {
      while (bVar13 = lVar9 != 0, lVar9 = lVar9 + -1, bVar13) {
        if (uVar10 < size) {
          curl_mfprintf(__stream,"%02x ",data[uVar10]);
        }
        else {
          fputs("   ",__stream);
        }
        uVar10 = uVar10 + 1;
      }
    }
    lVar9 = 0;
    pcVar8 = data + 2;
LAB_0010af2b:
    if ((lVar11 == lVar9) || (size <= uVar12 + lVar9)) goto LAB_0010afe9;
    if (tVar1 != TRACE_ASCII) {
      cVar2 = pcVar8[uVar12 - 2];
      if (0x5e < (byte)(cVar2 - 0x20U)) {
        cVar2 = '.';
      }
      curl_mfprintf(__stream,"%c",cVar2);
LAB_0010afce:
      lVar9 = lVar9 + 1;
      pcVar8 = pcVar8 + 1;
      goto LAB_0010af2b;
    }
    cVar2 = pcVar8[uVar12 - 2];
    if (((size <= uVar12 + lVar9 + 1) || (cVar2 != '\r')) ||
       (cVar2 = '\r', pcVar8[uVar12 - 1] != '\n')) {
      if (0x5e < (byte)(cVar2 - 0x20U)) {
        cVar2 = '.';
      }
      curl_mfprintf(__stream,"%c",cVar2);
      if (((uVar12 + lVar9 + 2 < size) && (pcVar8[uVar12 - 1] == '\r')) && (pcVar8[uVar12] == '\n'))
      {
        uVar12 = (uVar12 + lVar9) - 0x3d;
        goto LAB_0010afe9;
      }
      goto LAB_0010afce;
    }
    uVar12 = (uVar12 + lVar9) - 0x3e;
LAB_0010afe9:
    fputc(10,__stream);
  }
  fflush(__stream);
switchD_0010ad13_default:
  return 0;
}

Assistant:

int tool_debug_cb(CURL *handle, curl_infotype type,
                  char *data, size_t size,
                  void *userdata)
{
  struct OperationConfig *operation = userdata;
  struct GlobalConfig *config = operation->global;
  FILE *output = tool_stderr;
  const char *text;
  struct timeval tv;
  char timebuf[20];
  /* largest signed 64-bit is: 9,223,372,036,854,775,807
   * max length in decimal: 1 + (6*3) = 19
   * formatted via TRC_IDS_FORMAT_IDS_2 this becomes 2 + 19 + 1 + 19 + 2 = 43
   * negative xfer-id are not printed, negative conn-ids use TRC_IDS_FORMAT_1
   */
  char idsbuf[60];
  curl_off_t xfer_id, conn_id;

  (void)handle; /* not used */

  if(config->tracetime) {
    tv = tvrealnow();
    msnprintf(timebuf, sizeof(timebuf), "%s.%06ld ",
              hms_for_sec(tv.tv_sec), (long)tv.tv_usec);
  }
  else
    timebuf[0] = 0;

  if(handle && config->traceids &&
     !curl_easy_getinfo(handle, CURLINFO_XFER_ID, &xfer_id) && xfer_id >= 0) {
    if(!curl_easy_getinfo(handle, CURLINFO_CONN_ID, &conn_id) &&
        conn_id >= 0) {
      msnprintf(idsbuf, sizeof(idsbuf), TRC_IDS_FORMAT_IDS_2,
                xfer_id, conn_id);
    }
    else {
      msnprintf(idsbuf, sizeof(idsbuf), TRC_IDS_FORMAT_IDS_1, xfer_id);
    }
  }
  else
    idsbuf[0] = 0;

  if(!config->trace_stream) {
    /* open for append */
    if(!strcmp("-", config->trace_dump))
      config->trace_stream = stdout;
    else if(!strcmp("%", config->trace_dump))
      /* Ok, this is somewhat hackish but we do it undocumented for now */
      config->trace_stream = tool_stderr;
    else {
      config->trace_stream = fopen(config->trace_dump, FOPEN_WRITETEXT);
      config->trace_fopened = TRUE;
    }
  }

  if(config->trace_stream)
    output = config->trace_stream;

  if(!output) {
    warnf(config, "Failed to create/open output");
    return 0;
  }

  if(config->tracetype == TRACE_PLAIN) {
    static bool newl = FALSE;
    static bool traced_data = FALSE;

    switch(type) {
    case CURLINFO_HEADER_OUT:
      if(size > 0) {
        size_t st = 0;
        size_t i;
        for(i = 0; i < size - 1; i++) {
          if(data[i] == '\n') { /* LF */
            if(!newl) {
              log_line_start(output, timebuf, idsbuf, type);
            }
            (void)fwrite(data + st, i - st + 1, 1, output);
            st = i + 1;
            newl = FALSE;
          }
        }
        if(!newl)
          log_line_start(output, timebuf, idsbuf, type);
        (void)fwrite(data + st, i - st + 1, 1, output);
      }
      newl = (size && (data[size - 1] != '\n'));
      traced_data = FALSE;
      break;
    case CURLINFO_TEXT:
    case CURLINFO_HEADER_IN:
      if(!newl)
        log_line_start(output, timebuf, idsbuf, type);
      (void)fwrite(data, size, 1, output);
      newl = (size && (data[size - 1] != '\n'));
      traced_data = FALSE;
      break;
    case CURLINFO_DATA_OUT:
    case CURLINFO_DATA_IN:
    case CURLINFO_SSL_DATA_IN:
    case CURLINFO_SSL_DATA_OUT:
      if(!traced_data) {
        /* if the data is output to a tty and we are sending this debug trace
           to stderr or stdout, we do not display the alert about the data not
           being shown as the data _is_ shown then just not via this
           function */
        if(!config->isatty ||
           ((output != tool_stderr) && (output != stdout))) {
          if(!newl)
            log_line_start(output, timebuf, idsbuf, type);
          fprintf(output, "[%zu bytes data]\n", size);
          newl = FALSE;
          traced_data = TRUE;
        }
      }
      break;
    default: /* nada */
      newl = FALSE;
      traced_data = FALSE;
      break;
    }

    return 0;
  }

  switch(type) {
  case CURLINFO_TEXT:
    fprintf(output, "%s%s== Info: %.*s", timebuf, idsbuf, (int)size, data);
    FALLTHROUGH();
  default: /* in case a new one is introduced to shock us */
    return 0;

  case CURLINFO_HEADER_OUT:
    text = "=> Send header";
    break;
  case CURLINFO_DATA_OUT:
    text = "=> Send data";
    break;
  case CURLINFO_HEADER_IN:
    text = "<= Recv header";
    break;
  case CURLINFO_DATA_IN:
    text = "<= Recv data";
    break;
  case CURLINFO_SSL_DATA_IN:
    text = "<= Recv SSL data";
    break;
  case CURLINFO_SSL_DATA_OUT:
    text = "=> Send SSL data";
    break;
  }

  dump(timebuf, idsbuf, text, output, (unsigned char *) data, size,
       config->tracetype, type);
  return 0;
}